

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  _Head_base<0UL,_SQLite::Statement_*,_false> _Var2;
  int iVar3;
  punct_facet *__f;
  long lVar4;
  char *pcVar5;
  char *request_uri;
  Statement *pSVar6;
  ostream *poVar7;
  socklen_t __len;
  ulong uVar8;
  char cVar9;
  undefined8 this;
  bool bVar10;
  bool bVar11;
  double dVar12;
  unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_> query;
  Database db;
  HttpHandler http;
  double maxTemp [4];
  double minTemp [4];
  _Head_base<0UL,_SQLite::Statement_*,_false> local_4b8;
  string local_4b0;
  ostream *local_490;
  undefined1 local_488 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  string local_460;
  string local_440;
  undefined1 local_420 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410 [9];
  locale local_380;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  double adStack_98 [4];
  double adStack_78 [5];
  string local_50;
  
  bVar10 = 1 < (uint)argc;
  if (bVar10) {
    uVar8 = 2;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_420,argv[uVar8 - 1],(allocator<char> *)local_488);
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420
                      ,"-v");
      if ((iVar3 == 0) ||
         (iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_420,"--version"), iVar3 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vbus-server ",0xc)
        ;
        GitMetadata::Version_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_488._0_8_,local_488._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((_Impl *)local_488._0_8_ != (_Impl *)(local_488 + 0x10)) {
          operator_delete((void *)local_488._0_8_,local_478._M_allocated_capacity + 1);
        }
        if ((_Impl *)local_420._0_8_ != (_Impl *)(local_420 + 0x10)) {
          operator_delete((void *)local_420._0_8_,local_410[0]._M_allocated_capacity + 1);
        }
        if (bVar10) {
          return 0;
        }
        break;
      }
      if ((_Impl *)local_420._0_8_ != (_Impl *)(local_420 + 0x10)) {
        operator_delete((void *)local_420._0_8_,local_410[0]._M_allocated_capacity + 1);
      }
      bVar10 = uVar8 < (ulong)(long)argc;
      bVar11 = uVar8 != (long)argc;
      uVar8 = uVar8 + 1;
    } while (bVar11);
  }
  std::locale::locale((locale *)local_488,
                      (locale *)(std::ostream::_M_insert<double> + *(long *)(std::cout + -0x18)));
  __f = (punct_facet *)operator_new(0x18);
  *(undefined8 *)__f = 0;
  *(undefined8 *)&__f->field_0x8 = 0;
  *(undefined8 *)&__f->field_0x10 = 0;
  std::__cxx11::numpunct<char>::numpunct((ulong)__f);
  *(undefined ***)__f = &PTR__numpunct_001e8f70;
  std::locale::locale<punct_facet>((locale *)local_420,(locale *)local_488,__f);
  std::ios::imbue(&local_380);
  std::locale::~locale(&local_380);
  std::locale::~locale((locale *)local_420);
  std::locale::~locale((locale *)local_488);
  lVar4 = 0;
  do {
    *(undefined8 *)((long)adStack_78 + lVar4) = 0x7ff0000000000000;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x20);
  lVar4 = 0;
  do {
    *(undefined8 *)((long)adStack_98 + lVar4) = 0xfff0000000000000;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x20);
  pcVar5 = getenv("HTTP_ACCEPT_ENCODING");
  request_uri = getenv("REQUEST_URI");
  HttpHandler::HttpHandler((HttpHandler *)local_420,pcVar5,request_uri,(ostream *)&std::cout);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"timespan","");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"-1 hour","");
  HttpHandler::setDefault((HttpHandler *)local_420,&local_b8,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"format","");
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"csv","");
  HttpHandler::setDefault((HttpHandler *)local_420,&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"start","");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"now","");
  HttpHandler::setDefault((HttpHandler *)local_420,&local_138,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"clip","");
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"0","");
  HttpHandler::setDefault((HttpHandler *)local_420,&local_178,&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"format","");
  HttpHandler::param((string *)local_488,(HttpHandler *)local_420,&local_1b8);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488,
                     "csv");
  if ((_Impl *)local_488._0_8_ != (_Impl *)(local_488 + 0x10)) {
    operator_delete((void *)local_488._0_8_,local_478._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (iVar3 == 0) {
    pcVar5 = "text/comma-separated-values";
LAB_00115f24:
    HttpHandler::setContentType((HttpHandler *)local_420,pcVar5);
  }
  else {
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"format","");
    HttpHandler::param((string *)local_488,(HttpHandler *)local_420,&local_1d8);
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_488,"json");
    if ((_Impl *)local_488._0_8_ != (_Impl *)(local_488 + 0x10)) {
      operator_delete((void *)local_488._0_8_,local_478._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (iVar3 == 0) {
      pcVar5 = "application/json";
      goto LAB_00115f24;
    }
  }
  HttpHandler::sendHeader((HttpHandler *)local_420);
  local_490 = HttpHandler::getStream((HttpHandler *)local_420);
  __len = 0;
  SQLite::Database::Database((Database *)local_488,"/srv/http/data/vbus.sqlite",1,0,(char *)0x0);
  SQLite::Database::setBusyTimeout((Database *)local_488,3000);
  local_4b8._M_head_impl = (Statement *)0x0;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"timespan","");
  HttpHandler::param(&local_4b0,(HttpHandler *)local_420,&local_1f8);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_4b0,"single");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (iVar3 == 0) {
    pSVar6 = (Statement *)operator_new(0x70);
    SQLite::Statement::Statement
              (pSVar6,(Database *)local_488,
               "SELECT datetime(time, \'localtime\') as time, temp1, temp2, temp3, temp4, pump1, pump2 FROM data ORDER BY id DESC LIMIT 1"
              );
LAB_00116380:
    this = local_4b8._M_head_impl;
    bVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_4b8._M_head_impl !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    local_4b8._M_head_impl = pSVar6;
    if (bVar10) {
      SQLite::Statement::~Statement((Statement *)this);
      uVar8 = 0x70;
LAB_00116474:
      operator_delete((void *)this,uVar8);
    }
  }
  else {
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"timespan","");
    HttpHandler::param(&local_4b0,(HttpHandler *)local_420,&local_218);
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_4b0,"current");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if (iVar3 == 0) {
      pSVar6 = (Statement *)operator_new(0x70);
      SQLite::Statement::Statement
                (pSVar6,(Database *)local_488,
                 "SELECT datetime(time, \'localtime\') as time, temp1, temp2, temp3, temp4, pump1, pump2 FROM data WHERE time > (SELECT DATETIME(\'now\', \'-5 minutes\')) ORDER BY id DESC LIMIT 1"
                );
      goto LAB_00116380;
    }
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"start","");
    HttpHandler::param(&local_4b0,(HttpHandler *)local_420,&local_238);
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_4b0,"now");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if (iVar3 == 0) {
      pSVar6 = (Statement *)operator_new(0x70);
      SQLite::Statement::Statement
                (pSVar6,(Database *)local_488,
                 "SELECT datetime(time, \'localtime\') as time, temp1, temp2, temp3, temp4, pump1, pump2 FROM data WHERE time > (SELECT DATETIME(\'now\', ?)) ORDER BY time"
                );
      _Var2._M_head_impl = local_4b8._M_head_impl;
      bVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_4b8._M_head_impl !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
      local_4b8._M_head_impl = pSVar6;
      if (bVar10) {
        SQLite::Statement::~Statement(_Var2._M_head_impl);
        operator_delete(_Var2._M_head_impl,0x70);
      }
      _Var2._M_head_impl = local_4b8._M_head_impl;
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"timespan","");
      HttpHandler::param(&local_4b0,(HttpHandler *)local_420,&local_2b8);
      SQLite::Statement::bind(_Var2._M_head_impl,1,(sockaddr *)&local_4b0,__len);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
      this = local_2b8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p == &local_2b8.field_2) goto LAB_00116479;
LAB_00116471:
      uVar8 = local_2b8.field_2._M_allocated_capacity + 1;
      goto LAB_00116474;
    }
    pSVar6 = (Statement *)operator_new(0x70);
    SQLite::Statement::Statement
              (pSVar6,(Database *)local_488,
               "SELECT datetime(time, \'localtime\') as time, temp1, temp2, temp3, temp4, pump1, pump2 FROM data WHERE time > (SELECT DATETIME(?, \'utc\')) AND time < (SELECT DATETIME(?, \'utc\', ?)) ORDER BY time"
              );
    _Var2._M_head_impl = local_4b8._M_head_impl;
    bVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_4b8._M_head_impl !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    local_4b8._M_head_impl = pSVar6;
    if (bVar10) {
      SQLite::Statement::~Statement(_Var2._M_head_impl);
      operator_delete(_Var2._M_head_impl,0x70);
    }
    _Var2._M_head_impl = local_4b8._M_head_impl;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"start","");
    HttpHandler::param(&local_4b0,(HttpHandler *)local_420,&local_258);
    SQLite::Statement::bind(_Var2._M_head_impl,1,(sockaddr *)&local_4b0,__len);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    _Var2._M_head_impl = local_4b8._M_head_impl;
    local_278._M_allocated_capacity = (size_type)&local_268;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"start","");
    HttpHandler::param(&local_4b0,(HttpHandler *)local_420,(string *)&local_278);
    SQLite::Statement::bind(_Var2._M_head_impl,2,(sockaddr *)&local_4b0,__len);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_allocated_capacity != &local_268) {
      operator_delete((void *)local_278._M_allocated_capacity,local_268._M_allocated_capacity + 1);
    }
    _Var2._M_head_impl = local_4b8._M_head_impl;
    local_298._M_allocated_capacity = (size_type)&local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"timespan","");
    HttpHandler::param(&local_4b0,(HttpHandler *)local_420,(string *)&local_298);
    SQLite::Statement::bind(_Var2._M_head_impl,3,(sockaddr *)&local_4b0,__len);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
    }
    local_2b8.field_2._M_allocated_capacity = local_288._M_allocated_capacity;
    this = local_298._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_allocated_capacity != &local_288) goto LAB_00116471;
  }
LAB_00116479:
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"format","");
  HttpHandler::param(&local_4b0,(HttpHandler *)local_420,&local_2d8);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_4b0,"csv");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (iVar3 == 0) {
    lVar4 = 0x4a;
    pcVar5 = "Datum,Ofen,Speicher-unten,Speicher-oben,Heizung,Ventil-Ofen,Ventil-Heizung";
  }
  else {
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"format","");
    HttpHandler::param(&local_4b0,(HttpHandler *)local_420,&local_2f8);
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_4b0,"json");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (iVar3 != 0) goto LAB_001165f3;
    lVar4 = 9;
    pcVar5 = "{\"data\":[";
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_490,pcVar5,lVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)local_490 + -0x18) + (char)local_490);
  std::ostream::put((char)local_490);
  std::ostream::flush();
LAB_001165f3:
  bVar10 = true;
  while (bVar11 = SQLite::Statement::executeStep(local_4b8._M_head_impl), bVar11) {
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"format","");
    HttpHandler::param(&local_4b0,(HttpHandler *)local_420,&local_318);
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_4b0,"csv");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    _Var2._M_head_impl = local_4b8._M_head_impl;
    if (iVar3 == 0) {
      local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"clip","");
      HttpHandler::param(&local_4b0,(HttpHandler *)local_420,&local_440);
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_4b0,"1");
      printCsvResult(_Var2._M_head_impl,local_490,false,iVar3 == 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != &local_440.field_2) {
        operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"format","");
      HttpHandler::param(&local_4b0,(HttpHandler *)local_420,&local_460);
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_4b0,"json");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != &local_460.field_2) {
        operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        printJsonResult(local_4b8._M_head_impl,local_490,bVar10);
      }
    }
    lVar4 = 0;
    do {
      lVar1 = lVar4 + 1;
      SQLite::Statement::getColumn((Column *)&local_4b0,local_4b8._M_head_impl,(int)lVar1);
      dVar12 = SQLite::Column::getDouble((Column *)&local_4b0);
      if (adStack_78[lVar4] <= dVar12) {
        dVar12 = adStack_78[lVar4];
      }
      adStack_78[lVar4] = dVar12;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0._M_string_length);
      }
      SQLite::Statement::getColumn((Column *)&local_4b0,local_4b8._M_head_impl,(int)lVar4 + 1);
      dVar12 = SQLite::Column::getDouble((Column *)&local_4b0);
      if (dVar12 <= adStack_98[lVar4]) {
        dVar12 = adStack_98[lVar4];
      }
      adStack_98[lVar4] = dVar12;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0._M_string_length);
      }
      lVar4 = lVar1;
    } while (lVar1 != 4);
    bVar10 = false;
    HttpHandler::process((HttpHandler *)local_420);
  }
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"format","");
  HttpHandler::param(&local_4b0,(HttpHandler *)local_420,&local_338);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_4b0,"json");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if (iVar3 == 0) {
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"timespan","");
    HttpHandler::param(&local_4b0,(HttpHandler *)local_420,&local_358);
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_4b0,"single");
    if (iVar3 == 0) {
      bVar10 = true;
    }
    else {
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"timespan","");
      HttpHandler::param(&local_50,(HttpHandler *)local_420,&local_378);
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_50,"current");
      bVar10 = iVar3 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
    }
    cVar9 = (char)*(undefined8 *)(*(long *)local_490 + -0x18) + (char)local_490;
    if (bVar10) {
      std::ios::widen(cVar9);
      std::ostream::put((char)local_490);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]}",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    else {
      std::ios::widen(cVar9);
      std::ostream::put((char)local_490);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
      for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>(local_490,",\"temp",6);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_490,(int)lVar4 + 1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\": {\"min\": ",0xb);
        poVar7 = std::ostream::_M_insert<double>(adStack_78[lVar4]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", \"max\": ",9);
        poVar7 = std::ostream::_M_insert<double>(adStack_98[lVar4]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_490,"}",1);
    }
    HttpHandler::process((HttpHandler *)local_420);
  }
  HttpHandler::flush((HttpHandler *)local_420);
  std::unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::~unique_ptr
            ((unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_> *)&local_4b8);
  SQLite::Database::~Database((Database *)local_488);
  HttpHandler::~HttpHandler((HttpHandler *)local_420);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
    for (size_t idx = 1; idx < argc; idx++)
    {
        auto arg = std::string(argv[idx]);
        if (arg == "-v" || arg == "--version")
        {
            std::cout << "vbus-server " << GitMetadata::Version() << std::endl;
            return 0;
        }
    }
    
    // Set decimal seperator to '.'
    std::cout.imbue(std::locale(std::cout.getloc(), new punct_facet()));

    double minTemp[4];
    double maxTemp[4];
    std::fill_n(minTemp, 4,  std::numeric_limits<double>::infinity());
    std::fill_n(maxTemp, 4, -std::numeric_limits<double>::infinity());

    // Get HTTP handler and set default paramter
    HttpHandler http(std::getenv("HTTP_ACCEPT_ENCODING"), std::getenv("REQUEST_URI"), std::cout);
    http.setDefault("timespan", "-1 hour");
    http.setDefault("format", "csv");
    http.setDefault("start", "now");
    http.setDefault("clip", "0");

    // Print HTTP header
    if (http.param("format") == "csv")
    {
        http.setContentType("text/comma-separated-values");
    }
    else if (http.param("format") == "json")
    {
        http.setContentType("application/json");
    }

    http.sendHeader();
    auto outputStream = http.getStream();

    try
    {
        SQLite::Database db(DB_PATH);
        db.setBusyTimeout(3000);

        // Build sqlite query
        std::unique_ptr<SQLite::Statement> query;

        if (http.param("timespan") == "single")
        {
            query.reset(new SQLite::Statement(db, SELECT_SINGLE));
        }
        else if (http.param("timespan") == "current")
        {
            query.reset(new SQLite::Statement(db, SELECT_CURRENT));

        }
        else
        {
            if (http.param("start") != "now")
            {
                query.reset(new SQLite::Statement(db, SELECT_TIMESPAN_RANGE));
                query->bind(1, http.param("start"));
                query->bind(2, http.param("start"));
                query->bind(3, http.param("timespan"));
            }
            else
            {
                query.reset(new SQLite::Statement(db, SELECT_TIMESPAN));
                query->bind(1, http.param("timespan"));
            }
        }

        if (http.param("format") == "csv")
        {
            *outputStream << CSV_HEADER << std::endl;
        }
        else if (http.param("format") == "json")
        {
            *outputStream << "{\"data\":[" << std::endl;
        }

        bool isFirstRow = true;

        while (query->executeStep())
        {
            if (http.param("format") == "csv")
            {
                printCsvResult(*query, *outputStream, isFirstRow, http.param("clip") == "1");
            }
            else if (http.param("format") == "json")
            {
                printJsonResult(*query, *outputStream, isFirstRow);
            }

            // Update min/max stats
            for (int idx=0; idx<4; idx++)
            {
                minTemp[idx] = std::min(minTemp[idx], query->getColumn(idx+1).getDouble());
                maxTemp[idx] = std::max(maxTemp[idx], query->getColumn(idx+1).getDouble());
            }

            http.process();

            isFirstRow = false;
        }

        // Add min/max stats to json response
        if (http.param("format") == "json")
        {
            if (http.param("timespan") == "single" || http.param("timespan") == "current")
            {
                *outputStream << std::endl << "]}" << std::endl;
            }
            else
            {
                *outputStream << std::endl << "]";

                for (int idx=0; idx<4; idx++)
                {
                    *outputStream << ",\"temp" << idx+1 << "\": {\"min\": " << minTemp[idx] << ", \"max\": " << maxTemp[idx] << "}" << std::endl;
                }

                *outputStream << "}";
            }

            http.process();
        }

        http.flush();
    }
    catch (std::exception& e)
    {
        std::cerr << e.what() << std::endl;
        return 1;
    }

    return 0;
}